

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa_asn1.cc
# Opt level: O3

int rsa_pub_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  int iVar1;
  RSA *r;
  CBS null;
  CBS CStack_28;
  
  iVar1 = CBS_get_asn1(params,&CStack_28,5);
  if (((iVar1 == 0) || (CStack_28.len != 0)) || (params->len != 0)) {
    iVar1 = 0;
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa_asn1.cc"
                  ,0x37);
  }
  else {
    r = RSA_parse_public_key(key);
    if ((r == (RSA *)0x0) || (key->len != 0)) {
      iVar1 = 0;
      ERR_put_error(6,0,0x66,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa_asn1.cc"
                    ,0x3d);
      RSA_free((RSA *)r);
    }
    else {
      evp_pkey_set_method(out,&rsa_asn1_meth);
      out->pkey = r;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int rsa_pub_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See RFC 3279, section 2.3.1.

  // The parameters must be NULL.
  CBS null;
  if (!CBS_get_asn1(params, &null, CBS_ASN1_NULL) || CBS_len(&null) != 0 ||
      CBS_len(params) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  RSA *rsa = RSA_parse_public_key(key);
  if (rsa == NULL || CBS_len(key) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    RSA_free(rsa);
    return 0;
  }

  EVP_PKEY_assign_RSA(out, rsa);
  return 1;
}